

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall
fasttext::Dictionary::getStringNoNewline
          (Dictionary *this,string_view in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  string_view str;
  string_view w;
  string_view w_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  size_t in_RDI;
  undefined1 auVar5 [16];
  entry_type type;
  int32_t wid;
  uint32_t h;
  int32_t ntokens;
  string_view token;
  vector<int,_std::allocator<int>_> word_hashes;
  undefined4 in_stack_fffffffffffffef8;
  int32_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  entry_type in_stack_ffffffffffffff16;
  char *in_stack_ffffffffffffff20;
  char *pcVar6;
  Dictionary *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff44;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  Dictionary *in_stack_ffffffffffffff50;
  string_view *in_stack_ffffffffffffff58;
  int local_54;
  undefined4 local_50;
  int32_t in_stack_ffffffffffffffb4;
  Dictionary *in_stack_ffffffffffffffb8;
  Dictionary *pDVar7;
  Dictionary *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a9769);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  local_54 = 0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a978e);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a979b);
  do {
    iVar4 = (int32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    uVar1 = anon_unknown_6::readWordNoNewline
                      (in_stack_ffffffffffffff58,(string_view *)in_stack_ffffffffffffff50);
    if (!(bool)uVar1) break;
    str._M_str = in_stack_ffffffffffffff20;
    str._M_len = in_RDI;
    uVar3 = hash((Dictionary *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),str);
    w._M_str = in_stack_ffffffffffffff20;
    w._M_len = in_RDI;
    iVar4 = getId((Dictionary *)
                  CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),w,
                  (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    if (iVar4 < 0) {
      in_stack_ffffffffffffff58 = (string_view *)CONCAT44(in_stack_ffffffffffffffb4,local_50);
      w_00._M_str = in_stack_ffffffffffffff20;
      w_00._M_len = in_RDI;
      in_stack_ffffffffffffff16 =
           getType((Dictionary *)
                   CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                   w_00);
      in_stack_ffffffffffffff38 = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffff16 =
           getType((Dictionary *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
      in_stack_ffffffffffffff38 = in_stack_ffffffffffffffb8;
    }
    local_54 = local_54 + 1;
    if (in_stack_ffffffffffffff16 == word) {
      in_stack_ffffffffffffff48 =
           (vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffb4,local_50);
      pDVar7 = in_stack_ffffffffffffff38;
      addSubwords(in_stack_ffffffffffffffc0,
                  (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38,
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff44 = uVar3;
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff38;
      in_stack_ffffffffffffff38 = pDVar7;
    }
    else if ((in_stack_ffffffffffffff16 == label) && (-1 < iVar4)) {
      in_stack_ffffffffffffff40 = iVar4 - *(int *)(in_RDI + 0x5c);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    pcVar6 = (char *)CONCAT44(in_stack_ffffffffffffffb4,local_50);
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff38;
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)EOS_abi_cxx11_);
    in_stack_ffffffffffffff20 = auVar5._0_8_;
    __x._M_str = pcVar6;
    __x._M_len = auVar5._8_8_;
    __y._M_str = in_stack_ffffffffffffff20;
    __y._M_len = in_RDI;
    bVar2 = std::operator==(__x,__y);
    iVar4 = (int32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  } while (!bVar2);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a99e0);
  addWordNgrams(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                (vector<int,_std::allocator<int>_> *)
                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar4);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  return local_54;
}

Assistant:

int32_t Dictionary::getStringNoNewline(
    std::string_view in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string_view token;
  int32_t ntokens = 0;

  words.clear();
  labels.clear();
  while (readWordNoNewline(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}